

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_sha512_ret(uchar *input,size_t ilen,uchar *output,int is384)

{
  long lVar1;
  bool bVar2;
  mbedtls_sha512_context local_108;
  
  lVar1 = 0;
  memset(&local_108,0,0xd8);
  bVar2 = is384 == 0;
  local_108.state[0] = 0xcbbb9d5dc1059ed8;
  if (bVar2) {
    local_108.state[0] = 0x6a09e667f3bcc908;
  }
  local_108.state[1] = 0x629a292a367cd507;
  if (bVar2) {
    local_108.state[1] = 0xbb67ae8584caa73b;
  }
  local_108.state[2] = 0x9159015a3070dd17;
  if (bVar2) {
    local_108.state[2] = 0x3c6ef372fe94f82b;
  }
  local_108.state[3] = 0x152fecd8f70e5939;
  if (bVar2) {
    local_108.state[3] = 0xa54ff53a5f1d36f1;
  }
  local_108.state[4] = 0x67332667ffc00b31;
  if (bVar2) {
    local_108.state[4] = 0x510e527fade682d1;
  }
  local_108.state[5] = 0x8eb44a8768581511;
  if (bVar2) {
    local_108.state[5] = 0x9b05688c2b3e6c1f;
  }
  local_108.state[6] = 0xdb0c2e0d64f98fa7;
  if (bVar2) {
    local_108.state[6] = 0x1f83d9abfb41bd6b;
  }
  local_108.state[7] = 0x47b5481dbefa4fa4;
  if (bVar2) {
    local_108.state[7] = 0x5be0cd19137e2179;
  }
  local_108.is384 = is384;
  mbedtls_sha512_update_ret(&local_108,input,ilen);
  mbedtls_sha512_finish_ret(&local_108,output);
  do {
    *(undefined1 *)((long)local_108.total + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd8);
  return 0;
}

Assistant:

int mbedtls_sha512_ret( const unsigned char *input,
                    size_t ilen,
                    unsigned char output[64],
                    int is384 )
{
    int ret;
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );

    if( ( ret = mbedtls_sha512_starts_ret( &ctx, is384 ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_update_ret( &ctx, input, ilen ) ) != 0 )
        goto exit;

    if( ( ret = mbedtls_sha512_finish_ret( &ctx, output ) ) != 0 )
        goto exit;

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}